

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,FString *pstr,FString *def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  int iVar4;
  Value *this;
  Ch *cc;
  BYTE *copyStr;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 0) {
        copyStr = "";
      }
      else {
        if ((uVar1 >> 10 & 1) == 0) {
          __assert_fail("val->IsNull() || val->IsString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x83e,
                        "FSerializer &Serialize(FSerializer &, const char *, FString &, FString *)")
          ;
        }
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        copyStr = (BYTE *)UnicodeToString(cc);
      }
      FString::operator=(pstr,(char *)copyStr);
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 != 0) && (def != (FString *)0x0)) &&
        ((pFVar3->mInObject).Array[uVar2 - 1] != false)) &&
       (iVar4 = FString::Compare(pstr,def), iVar4 == 0)) {
      return arc;
    }
    FSerializer::WriteKey(arc,key);
    FWriter::String(arc->w,pstr->Chars);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FString &pstr, FString *def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || pstr.Compare(*def) != 0)
		{
			arc.WriteKey(key);
			arc.w->String(pstr.GetChars());
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = "";
			}
			else if (val->IsString())
			{
				pstr = UnicodeToString(val->GetString());
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = "";
				arc.mErrors++;
			}
		}
	}
	return arc;

}